

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O2

int vrna_E_ext_loop_5(vrna_fold_compound_t *fc)

{
  ushort uVar1;
  int iVar2;
  vrna_param_t *pvVar3;
  int *piVar4;
  vrna_gr_aux_t *pvVar5;
  vrna_sc_t *pvVar6;
  vrna_sc_t **ppvVar7;
  sc_wrapper_f5 *psVar8;
  short *psVar9;
  char *pcVar10;
  short **ppsVar11;
  uint **ppuVar12;
  uint *puVar13;
  int *piVar14;
  bool bVar15;
  undefined1 *puVar16;
  undefined1 *puVar17;
  uchar uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  long lVar27;
  vrna_callback_hc_evaluate *evaluate;
  code *pcVar28;
  sc_wrapper_f5 *stems;
  void *pvVar29;
  void *pvVar30;
  int *piVar31;
  int *piVar32;
  ulong uVar33;
  default_data *stems_00;
  short sVar34;
  uint uVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  code *pcVar40;
  sc_wrapper_f5 *hc_dat_local_00;
  default_data *pdVar41;
  long lVar42;
  default_data *hc_dat_local_01;
  ulong uVar43;
  code *pcVar44;
  vrna_callback_hc_evaluate *evaluate_00;
  vrna_callback_hc_evaluate *evaluate_01;
  vrna_callback_hc_evaluate *evaluate_02;
  ulong uVar45;
  sc_wrapper_f5 *psVar46;
  ulong uVar47;
  int iVar48;
  sc_wrapper_f5 *psVar49;
  sc_wrapper_f5 *psVar50;
  uint uVar51;
  int iVar52;
  long lVar53;
  bool bVar54;
  long local_190;
  int local_148;
  long local_128;
  sc_wrapper_f5 sc_wrapper;
  long local_70;
  default_data hc_dat_local;
  
  if (fc != (vrna_fold_compound_t *)0x0) {
    lVar27 = (long)(int)fc->length;
    pvVar3 = fc->params;
    piVar4 = (fc->matrices->field_2).field_0.f5;
    iVar23 = (pvVar3->model_details).dangles;
    iVar2 = (pvVar3->model_details).gquad;
    local_148 = (pvVar3->model_details).min_loop_size;
    pvVar5 = fc->aux_grammar;
    evaluate = prepare_hc_default(fc,&hc_dat_local);
    sc_wrapper.up = (int **)0x0;
    sc_wrapper.user_cb = (vrna_callback_sc_energy *)0x0;
    sc_wrapper.user_data = (void *)0x0;
    sc_wrapper.n_seq = 1;
    sc_wrapper.red_ext = (undefined1 *)0x0;
    sc_wrapper.red_stem = (undefined1 *)0x0;
    sc_wrapper.decomp_stem = (undefined1 *)0x0;
    sc_wrapper.decomp_stem1 = (undefined1 *)0x0;
    sc_wrapper.user_data_comparative = (void **)0x0;
    sc_wrapper.up_comparative = (int ***)0x0;
    sc_wrapper.user_cb_comparative = (vrna_callback_sc_energy **)0x0;
    if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
      ppvVar7 = (fc->field_23).field_1.scs;
      sc_wrapper.n_seq = (fc->field_23).field_1.n_seq;
      sc_wrapper.a2s = (fc->field_23).field_1.a2s;
      if (ppvVar7 != (vrna_sc_t **)0x0) {
        sc_wrapper.up_comparative = (int ***)vrna_alloc(sc_wrapper.n_seq << 3);
        sc_wrapper.user_cb_comparative =
             (vrna_callback_sc_energy **)vrna_alloc((fc->field_23).field_1.n_seq << 3);
        sc_wrapper.user_data_comparative = (void **)vrna_alloc((fc->field_23).field_1.n_seq << 3);
        bVar54 = false;
        bVar15 = false;
        for (uVar45 = 0; uVar45 < (fc->field_23).field_1.n_seq; uVar45 = uVar45 + 1) {
          if (ppvVar7[uVar45] != (vrna_sc_t *)0x0) {
            sc_wrapper.up_comparative[uVar45] = ppvVar7[uVar45]->energy_up;
            sc_wrapper.user_cb_comparative[uVar45] = ppvVar7[uVar45]->f;
            sc_wrapper.user_data_comparative[uVar45] = ppvVar7[uVar45]->data;
            if (ppvVar7[uVar45]->energy_up != (int **)0x0) {
              bVar54 = true;
            }
            if (ppvVar7[uVar45]->f != (vrna_callback_sc_energy *)0x0) {
              bVar15 = true;
            }
          }
        }
        if (bVar54) {
          bVar15 = !bVar15;
          pcVar28 = sc_user_def_f5_reduce_to_ext_comparative;
          if (bVar15) {
            pcVar28 = sc_default_f5_reduce_comparative;
          }
          pcVar40 = sc_user_def_f5_reduce_to_stem_comparative;
          if (bVar15) {
            pcVar40 = sc_default_f5_reduce_comparative;
          }
          pcVar44 = sc_user_def_f5_split_in_ext_stem_comparative;
          if (bVar15) {
            pcVar44 = sc_default_f5_split_in_ext_stem_comparative;
          }
          sc_wrapper.red_ext = pcVar28;
          sc_wrapper.red_stem = pcVar40;
          sc_wrapper.decomp_stem = pcVar44;
          sc_wrapper.decomp_stem1 = sc_user_def_f5_split_in_ext_stem1_comparative;
          if (bVar15) {
            sc_wrapper.decomp_stem1 = sc_default_f5_split_in_ext_stem1_comparative;
          }
        }
        else if (bVar15) {
          sc_wrapper.red_ext = sc_user_f5_reduce_to_ext_comparative;
          sc_wrapper.red_stem = sc_user_f5_reduce_to_stem_comparative;
          sc_wrapper.decomp_stem = sc_user_f5_split_in_ext_stem_comparative;
          sc_wrapper.decomp_stem1 = sc_user_f5_split_in_ext_stem1_comparative;
        }
      }
    }
    else if ((fc->type == VRNA_FC_TYPE_SINGLE) &&
            (pvVar6 = (fc->field_23).field_0.sc, pvVar6 != (vrna_sc_t *)0x0)) {
      sc_wrapper.up = pvVar6->energy_up;
      sc_wrapper.user_cb = pvVar6->f;
      sc_wrapper.user_data = pvVar6->data;
      if (sc_wrapper.up == (int **)0x0) {
        if (sc_wrapper.user_cb != (vrna_callback_sc_energy *)0x0) {
          sc_wrapper.red_ext = sc_user_f5_reduce_to_ext;
          sc_wrapper.red_stem = sc_user_f5_reduce_to_stem;
          sc_wrapper.decomp_stem = sc_user_f5_split_in_ext_stem;
          sc_wrapper.decomp_stem1 = sc_user_f5_split_in_ext_stem1;
        }
      }
      else {
        bVar54 = sc_wrapper.user_cb == (vrna_callback_sc_energy *)0x0;
        pcVar28 = sc_user_def_f5_reduce_to_ext;
        if (bVar54) {
          pcVar28 = sc_default_f5_reduce;
        }
        pcVar40 = sc_user_def_f5_reduce_to_stem;
        if (bVar54) {
          pcVar40 = sc_default_f5_reduce;
        }
        pcVar44 = sc_user_def_f5_split_in_ext_stem;
        if (bVar54) {
          pcVar44 = sc_default_f5_split_in_ext_stem;
        }
        sc_wrapper.red_ext = pcVar28;
        sc_wrapper.red_stem = pcVar40;
        sc_wrapper.decomp_stem = pcVar44;
        sc_wrapper.decomp_stem1 = sc_user_def_f5_split_in_ext_stem1;
        if (bVar54) {
          sc_wrapper.decomp_stem1 = sc_default_f5_split_in_ext_stem1;
        }
      }
    }
    *piVar4 = 0;
    iVar20 = -1;
    if (-1 < local_148) {
      iVar20 = local_148;
    }
    for (uVar45 = 1; iVar20 + 2 != uVar45; uVar45 = uVar45 + 1) {
      iVar19 = reduce_f5_up(fc,(int)uVar45,evaluate,&hc_dat_local,&sc_wrapper);
      piVar4[uVar45] = iVar19;
    }
    if ((pvVar5 != (vrna_gr_aux_t *)0x0) && (pvVar5->cb_aux_f != (vrna_callback_gr_rule *)0x0)) {
      for (uVar45 = 1; iVar20 + 2 != uVar45; uVar45 = uVar45 + 1) {
        iVar19 = (*pvVar5->cb_aux_f)(fc,1,(int)uVar45,pvVar5->data);
        if (piVar4[uVar45] < iVar19) {
          iVar19 = piVar4[uVar45];
        }
        piVar4[uVar45] = iVar19;
      }
    }
    psVar46 = (sc_wrapper_f5 *)(long)(local_148 + 2);
    if (iVar23 == 0) {
      for (; (long)psVar46 <= lVar27; psVar46 = (sc_wrapper_f5 *)((long)&psVar46->up + 1)) {
        iVar19 = (int)psVar46;
        pdVar41 = &hc_dat_local;
        iVar23 = reduce_f5_up(fc,iVar19,evaluate,pdVar41,&sc_wrapper);
        piVar4[(long)psVar46] = iVar23;
        psVar49 = &sc_wrapper;
        piVar31 = get_stem_contributions_d0(fc,iVar19,evaluate,pdVar41,&sc_wrapper);
        iVar20 = decompose_f5_ext_stem(fc,iVar19,piVar31);
        iVar23 = piVar31[1];
        if (iVar20 < piVar31[1]) {
          iVar23 = iVar20;
        }
        free(piVar31);
        if (piVar4[(long)psVar46] < iVar23) {
          iVar23 = piVar4[(long)psVar46];
        }
        piVar4[(long)psVar46] = iVar23;
        if (iVar2 != 0) {
          iVar20 = add_f5_gquad(fc,iVar19,evaluate_01,pdVar41,psVar49);
          if (iVar23 < iVar20) {
            iVar20 = iVar23;
          }
          piVar4[(long)psVar46] = iVar20;
        }
        if ((pvVar5 != (vrna_gr_aux_t *)0x0) && (pvVar5->cb_aux_f != (vrna_callback_gr_rule *)0x0))
        {
          iVar23 = (*pvVar5->cb_aux_f)(fc,1,iVar19,pvVar5->data);
          if (piVar4[(long)psVar46] < iVar23) {
            iVar23 = piVar4[(long)psVar46];
          }
          piVar4[(long)psVar46] = iVar23;
        }
      }
    }
    else if (iVar23 == 2) {
      local_128 = (long)psVar46 * 2 + -4;
      iVar23 = local_148;
      while( true ) {
        local_148 = local_148 + 1;
        psVar49 = &sc_wrapper;
        if (lVar27 < (long)psVar46) break;
        iVar19 = (int)psVar46;
        iVar20 = reduce_f5_up(fc,iVar19,evaluate,&hc_dat_local,psVar49);
        piVar4[(long)psVar46] = iVar20;
        stems = (sc_wrapper_f5 *)vrna_alloc(iVar19 * 4);
        puVar17 = sc_wrapper.decomp_stem;
        puVar16 = sc_wrapper.red_stem;
        uVar21 = fc->length;
        pvVar3 = fc->params;
        piVar31 = fc->jindx;
        psVar8 = (sc_wrapper_f5 *)(fc->matrices->field_2).field_0.c;
        uVar51 = (pvVar3->model_details).min_loop_size;
        iVar20 = piVar31[(long)psVar46];
        hc_dat_local_00 = (sc_wrapper_f5 *)(ulong)(~uVar51 + iVar19);
        if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
          uVar35 = (fc->field_23).field_1.n_seq;
          uVar33 = (ulong)uVar35;
          pcVar10 = (fc->field_23).field_0.ptype_pf_compat;
          pvVar6 = (fc->field_23).field_0.sc;
          ppsVar11 = (fc->field_23).field_1.S3;
          ppuVar12 = (fc->field_23).field_1.a2s;
          uVar35 = uVar35 * 2;
          pvVar29 = vrna_alloc(uVar35);
          pvVar30 = vrna_alloc(uVar35);
          for (uVar45 = 0; uVar33 != uVar45; uVar45 = uVar45 + 1) {
            puVar13 = ppuVar12[uVar45];
            sVar34 = -1;
            if (puVar13[(long)psVar46] < puVar13[(int)uVar21]) {
              sVar34 = ppsVar11[uVar45][(long)psVar46];
            }
            *(short *)((long)pvVar29 + uVar45 * 2) = sVar34;
            *(undefined2 *)((long)pvVar30 + uVar45 * 2) =
                 *(undefined2 *)(*(long *)(pcVar10 + uVar45 * 8) + (long)psVar46 * 2);
          }
          lVar53 = (long)(int)(~uVar51 + iVar19 + iVar20);
          for (psVar50 = hc_dat_local_00; iVar20 = (int)psVar50, 1 < iVar20;
              psVar50 = (sc_wrapper_f5 *)((long)&psVar50[-1].user_data_comparative + 7)) {
            *(uint *)((long)&stems->up + (long)psVar50 * 4) = 10000000;
            if (*(uint *)((long)&psVar8->up + lVar53 * 4) != 10000000) {
              psVar49 = (sc_wrapper_f5 *)0x12;
              uVar18 = (*evaluate)(1,iVar19,iVar20 + -1,iVar20,'\x12',&hc_dat_local);
              if (uVar18 != '\0') {
                *(uint *)((long)&stems->up + (long)psVar50 * 4) =
                     *(uint *)((long)&psVar8->up + lVar53 * 4);
                for (uVar45 = 0; uVar33 != uVar45; uVar45 = uVar45 + 1) {
                  uVar21 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar10 + uVar45 * 8) +
                                                            (long)psVar50 * 2),
                                             (int)*(short *)((long)pvVar30 + uVar45 * 2),
                                             &pvVar3->model_details);
                  iVar20 = -1;
                  if (1 < ppuVar12[uVar45][(long)psVar50]) {
                    iVar20 = (int)*(short *)(*(long *)(&pvVar6->type + uVar45 * 2) +
                                            (long)psVar50 * 2);
                  }
                  iVar20 = vrna_E_ext_stem(uVar21,iVar20,(int)*(short *)((long)pvVar29 + uVar45 * 2)
                                           ,pvVar3);
                  puVar13 = (uint *)((long)&stems->up + (long)psVar50 * 4);
                  *puVar13 = *puVar13 + iVar20;
                }
              }
            }
            lVar53 = lVar53 + -1;
          }
          if (puVar17 != (undefined1 *)0x0) {
            iVar20 = iVar23 - uVar51;
            for (; 1 < (int)hc_dat_local_00;
                hc_dat_local_00 =
                     (sc_wrapper_f5 *)((long)&hc_dat_local_00[-1].user_data_comparative + 7)) {
              if (*(uint *)((long)&stems->up + (long)hc_dat_local_00 * 4) != 10000000) {
                iVar22 = (*(code *)puVar17)((ulong)psVar46 & 0xffffffff,iVar20,hc_dat_local_00,
                                            &sc_wrapper);
                puVar13 = (uint *)((long)&stems->up + (long)hc_dat_local_00 * 4);
                *puVar13 = *puVar13 + iVar22;
              }
              iVar20 = iVar20 + -1;
            }
          }
          *(int *)((long)&stems->up + 4) = 10000000;
          iVar20 = piVar31[(long)psVar46];
          hc_dat_local_00 = psVar8;
          if (*(int *)((long)&psVar8->up + (long)iVar20 * 4 + 4) != 10000000) {
            psVar49 = (sc_wrapper_f5 *)0xe;
            hc_dat_local_00 = psVar46;
            uVar18 = (*evaluate)(1,iVar19,1,iVar19,'\x0e',&hc_dat_local);
            if (uVar18 != '\0') {
              *(int *)((long)&stems->up + 4) = *(int *)((long)&psVar8->up + (long)iVar20 * 4 + 4);
              for (uVar45 = 0; uVar33 != uVar45; uVar45 = uVar45 + 1) {
                uVar21 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar10 + uVar45 * 8) + 2),
                                           (int)*(short *)((long)pvVar30 + uVar45 * 2),
                                           &pvVar3->model_details);
                lVar53 = (long)*(short *)((long)pvVar29 + uVar45 * 2);
                if (lVar53 < 0) {
                  iVar20 = 0;
                }
                else {
                  iVar20 = pvVar3->dangle3[uVar21][lVar53];
                }
                if (2 < uVar21) {
                  iVar20 = iVar20 + pvVar3->TerminalAU;
                }
                piVar31 = (int *)((long)&stems->up + 4);
                *piVar31 = *piVar31 + iVar20;
              }
              hc_dat_local_00 = &sc_wrapper;
              if (puVar16 != (undefined1 *)0x0) {
                iVar20 = (*(code *)puVar16)(psVar46,1,(ulong)psVar46 & 0xffffffff);
                piVar31 = (int *)((long)&stems->up + 4);
                *piVar31 = *piVar31 + iVar20;
                hc_dat_local_00 = stems;
              }
            }
          }
          free(pvVar29);
          free(pvVar30);
        }
        else if (fc->type == VRNA_FC_TYPE_SINGLE) {
          psVar9 = (fc->field_23).field_0.sequence_encoding;
          uVar35 = 0xffffffff;
          if ((long)psVar46 < (long)(int)uVar21) {
            uVar35 = (uint)psVar9[(long)((long)&psVar46->up + 1)];
          }
          pcVar10 = (fc->field_23).field_0.ptype;
          iVar20 = (iVar20 + local_148) - uVar51;
          for (lVar53 = 0; iVar22 = (int)lVar53, iVar36 = iVar22 + (iVar23 - uVar51) + 1, 1 < iVar36
              ; lVar53 = lVar53 + -1) {
            *(undefined4 *)((long)&stems->up + lVar53 * 4 + (ulong)(local_148 - uVar51) * 4) =
                 10000000;
            if (*(int *)((long)&psVar8->up + lVar53 * 4 + (long)iVar20 * 4) != 10000000) {
              psVar49 = (sc_wrapper_f5 *)0x12;
              uVar18 = (*evaluate)(1,iVar19,iVar22 + (iVar23 - uVar51),iVar36,'\x12',&hc_dat_local);
              if (uVar18 != '\0') {
                uVar21 = vrna_get_ptype(iVar20 + iVar22,pcVar10);
                iVar22 = *(int *)((long)&psVar8->up + lVar53 * 4 + (long)iVar20 * 4);
                iVar36 = vrna_E_ext_stem(uVar21,(int)*(short *)((long)psVar9 +
                                                               lVar53 * 2 +
                                                               local_128 + (long)(int)uVar51 * -2),
                                         uVar35,pvVar3);
                *(int *)((long)&stems->up + lVar53 * 4 + (ulong)(local_148 - uVar51) * 4) =
                     iVar36 + iVar22;
              }
            }
          }
          if (puVar17 != (undefined1 *)0x0) {
            iVar20 = iVar23 - uVar51;
            for (; 1 < (int)hc_dat_local_00;
                hc_dat_local_00 =
                     (sc_wrapper_f5 *)((long)&hc_dat_local_00[-1].user_data_comparative + 7)) {
              if (*(uint *)((long)&stems->up + (long)hc_dat_local_00 * 4) != 10000000) {
                iVar22 = (*(code *)puVar17)((ulong)psVar46 & 0xffffffff,iVar20,hc_dat_local_00,
                                            &sc_wrapper);
                puVar13 = (uint *)((long)&stems->up + (long)hc_dat_local_00 * 4);
                *puVar13 = *puVar13 + iVar22;
              }
              iVar20 = iVar20 + -1;
            }
          }
          *(int *)((long)&stems->up + 4) = 10000000;
          iVar20 = piVar31[(long)psVar46];
          hc_dat_local_00 = psVar8;
          if (*(int *)((long)&psVar8->up + (long)iVar20 * 4 + 4) != 10000000) {
            psVar49 = (sc_wrapper_f5 *)0xe;
            hc_dat_local_00 = psVar46;
            uVar18 = (*evaluate)(1,iVar19,1,iVar19,'\x0e',&hc_dat_local);
            if (uVar18 != '\0') {
              uVar21 = vrna_get_ptype(iVar20 + 1,pcVar10);
              if ((int)uVar35 < 0) {
                iVar22 = 0;
              }
              else {
                iVar22 = pvVar3->dangle3[uVar21][uVar35];
              }
              if (2 < uVar21) {
                iVar22 = iVar22 + pvVar3->TerminalAU;
              }
              uVar21 = iVar22 + *(int *)((long)&psVar8->up + (long)iVar20 * 4 + 4);
              *(uint *)((long)&stems->up + 4) = uVar21;
              hc_dat_local_00 = (sc_wrapper_f5 *)(ulong)uVar21;
              if (puVar16 != (undefined1 *)0x0) {
                iVar20 = (*(code *)puVar16)(psVar46,1,(ulong)psVar46 & 0xffffffff,&sc_wrapper);
                piVar31 = (int *)((long)&stems->up + 4);
                *piVar31 = *piVar31 + iVar20;
                hc_dat_local_00 = stems;
              }
            }
          }
        }
        iVar22 = decompose_f5_ext_stem(fc,iVar19,(int *)stems);
        iVar20 = *(int *)((long)&stems->up + 4);
        if (iVar22 < iVar20) {
          iVar20 = iVar22;
        }
        free(stems);
        if (piVar4[(long)psVar46] < iVar20) {
          iVar20 = piVar4[(long)psVar46];
        }
        piVar4[(long)psVar46] = iVar20;
        if (iVar2 != 0) {
          iVar22 = add_f5_gquad(fc,iVar19,evaluate_00,(default_data *)hc_dat_local_00,psVar49);
          if (iVar20 < iVar22) {
            iVar22 = iVar20;
          }
          piVar4[(long)psVar46] = iVar22;
        }
        if ((pvVar5 != (vrna_gr_aux_t *)0x0) && (pvVar5->cb_aux_f != (vrna_callback_gr_rule *)0x0))
        {
          iVar20 = (*pvVar5->cb_aux_f)(fc,1,iVar19,pvVar5->data);
          if (piVar4[(long)psVar46] < iVar20) {
            iVar20 = piVar4[(long)psVar46];
          }
          piVar4[(long)psVar46] = iVar20;
        }
        psVar46 = (sc_wrapper_f5 *)((long)&psVar46->up + 1);
        iVar23 = iVar23 + 1;
        local_128 = local_128 + 2;
      }
    }
    else {
      local_70 = (long)psVar46 * 2 + -2;
      iVar23 = local_148;
      for (; local_148 = local_148 + 1, (long)psVar46 <= lVar27;
          psVar46 = (sc_wrapper_f5 *)((long)&psVar46->up + 1)) {
        iVar36 = (int)psVar46;
        iVar20 = reduce_f5_up(fc,iVar36,evaluate,&hc_dat_local,&sc_wrapper);
        piVar4[(long)psVar46] = iVar20;
        piVar31 = get_stem_contributions_d0(fc,iVar36,evaluate,&hc_dat_local,&sc_wrapper);
        iVar22 = decompose_f5_ext_stem(fc,iVar36,piVar31);
        iVar20 = piVar31[1];
        free(piVar31);
        uVar51 = iVar36 * 4;
        piVar32 = (int *)vrna_alloc(uVar51);
        puVar17 = sc_wrapper.decomp_stem;
        puVar16 = sc_wrapper.red_stem;
        pvVar3 = fc->params;
        piVar31 = fc->jindx;
        piVar14 = (fc->matrices->field_2).field_0.c;
        uVar21 = (pvVar3->model_details).min_loop_size;
        iVar19 = piVar31[(long)psVar46];
        if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
          uVar35 = (fc->field_23).field_1.n_seq;
          uVar33 = (ulong)uVar35;
          pcVar10 = (fc->field_23).field_0.ptype_pf_compat;
          pvVar6 = (fc->field_23).field_0.sc;
          ppuVar12 = (fc->field_23).field_1.a2s;
          pvVar29 = vrna_alloc(uVar35 * 2);
          for (uVar45 = 0; uVar33 != uVar45; uVar45 = uVar45 + 1) {
            *(undefined2 *)((long)pvVar29 + uVar45 * 2) =
                 *(undefined2 *)(*(long *)(pcVar10 + uVar45 * 8) + (long)psVar46 * 2);
          }
          lVar53 = (long)(int)((iVar36 - uVar21) + iVar19);
          for (uVar45 = (ulong)(~uVar21 + iVar36); iVar19 = (int)uVar45, 1 < iVar19;
              uVar45 = uVar45 - 1) {
            piVar32[uVar45] = 10000000;
            if ((piVar14[lVar53] != 10000000) &&
               (uVar18 = (*evaluate)(1,iVar36,iVar19 + -1,iVar19 + 1,'\x12',&hc_dat_local),
               uVar18 != '\0')) {
              piVar32[uVar45] = piVar14[lVar53];
              for (uVar43 = 0; uVar33 != uVar43; uVar43 = uVar43 + 1) {
                uVar35 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar10 + uVar43 * 8) + 2 +
                                                          uVar45 * 2),
                                           (int)*(short *)((long)pvVar29 + uVar43 * 2),
                                           &pvVar3->model_details);
                iVar19 = 0;
                if ((1 < ppuVar12[uVar43][uVar45 + 1]) &&
                   (lVar42 = (long)*(short *)(*(long *)(&pvVar6->type + uVar43 * 2) + 2 + uVar45 * 2
                                             ), -1 < lVar42)) {
                  iVar19 = pvVar3->dangle5[uVar35][lVar42];
                }
                if (2 < uVar35) {
                  iVar19 = iVar19 + pvVar3->TerminalAU;
                }
                piVar32[uVar45] = iVar19;
              }
            }
            lVar53 = lVar53 + -1;
          }
          if (puVar17 != (undefined1 *)0x0) {
            iVar19 = iVar23 - uVar21;
            for (lVar53 = 0; iVar48 = (int)lVar53, 1 < iVar19 + iVar48 + 1; lVar53 = lVar53 + -1) {
              if (piVar32[(ulong)(local_148 - uVar21) + lVar53] != 10000000) {
                iVar48 = (*(code *)puVar17)(psVar46,iVar19 + iVar48,iVar19 + iVar48 + 2,&sc_wrapper)
                ;
                piVar32[(ulong)(local_148 - uVar21) + lVar53] =
                     piVar32[(ulong)(local_148 - uVar21) + lVar53] + iVar48;
              }
            }
            uVar45 = (ulong)(local_148 - uVar21) + lVar53;
          }
          piVar32[1] = 10000000;
          iVar19 = piVar31[(long)psVar46];
          if ((piVar14[(long)iVar19 + 2] != 10000000) &&
             (uVar18 = (*evaluate)(1,iVar36,2,iVar36,'\x0e',&hc_dat_local), uVar18 != '\0')) {
            piVar32[1] = piVar14[(long)iVar19 + 2];
            for (uVar43 = 0; uVar33 != uVar43; uVar43 = uVar43 + 1) {
              uVar21 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar10 + uVar43 * 8) + 4),
                                         (int)*(short *)((long)pvVar29 + uVar43 * 2),
                                         &pvVar3->model_details);
              iVar19 = 0;
              if ((1 < ppuVar12[uVar43][2]) &&
                 (lVar53 = (long)*(short *)(*(long *)(&pvVar6->type + uVar43 * 2) + 4), -1 < lVar53)
                 ) {
                iVar19 = pvVar3->dangle5[uVar21][lVar53];
              }
              if (2 < uVar21) {
                iVar19 = iVar19 + pvVar3->TerminalAU;
              }
              piVar32[(int)uVar45] = iVar19;
            }
            if (puVar16 != (undefined1 *)0x0) {
              iVar19 = (*(code *)puVar16)(psVar46,2,(ulong)psVar46 & 0xffffffff,&sc_wrapper);
              piVar32[1] = piVar32[1] + iVar19;
            }
          }
          free(pvVar29);
        }
        else if (fc->type == VRNA_FC_TYPE_SINGLE) {
          psVar9 = (fc->field_23).field_0.sequence_encoding;
          pcVar10 = (fc->field_23).field_0.ptype;
          uVar45 = (ulong)(~uVar21 + iVar36);
          iVar48 = iVar23 - uVar21;
          iVar19 = (iVar19 + iVar36) - uVar21;
          for (lVar53 = 0; iVar37 = (int)lVar53, 1 < iVar37 + iVar48 + 1; lVar53 = lVar53 + -1) {
            piVar32[(ulong)(local_148 - uVar21) + lVar53] = 10000000;
            if ((piVar14[iVar19 + lVar53] != 10000000) &&
               (uVar18 = (*evaluate)(1,iVar36,iVar37 + iVar48,iVar37 + iVar48 + 2,'\x12',
                                     &hc_dat_local), uVar18 != '\0')) {
              uVar35 = vrna_get_ptype(iVar19 + iVar37,pcVar10);
              lVar42 = (long)*(short *)((long)psVar9 +
                                       lVar53 * 2 + local_70 + (long)(int)uVar21 * -2);
              if (lVar42 < 0) {
                iVar37 = 0;
              }
              else {
                iVar37 = pvVar3->dangle5[uVar35][lVar42];
              }
              if (2 < uVar35) {
                iVar37 = iVar37 + pvVar3->TerminalAU;
              }
              piVar32[(ulong)(local_148 - uVar21) + lVar53] = iVar37 + piVar14[iVar19 + lVar53];
            }
          }
          if (puVar17 != (undefined1 *)0x0) {
            iVar19 = iVar36 - uVar21;
            iVar48 = iVar23 - uVar21;
            for (; 1 < (int)uVar45; uVar45 = uVar45 - 1) {
              if (piVar32[uVar45] != 10000000) {
                iVar37 = (*(code *)puVar17)((ulong)psVar46 & 0xffffffff,iVar48,iVar19,&sc_wrapper);
                piVar32[uVar45] = piVar32[uVar45] + iVar37;
              }
              iVar19 = iVar19 + -1;
              iVar48 = iVar48 + -1;
            }
          }
          piVar32[1] = 10000000;
          iVar19 = piVar31[(long)psVar46];
          if ((piVar14[(long)iVar19 + 2] != 10000000) &&
             (uVar18 = (*evaluate)(1,iVar36,2,iVar36,'\x0e',&hc_dat_local), uVar18 != '\0')) {
            uVar21 = vrna_get_ptype(iVar19 + 2,pcVar10);
            lVar53 = (long)psVar9[1];
            if (lVar53 < 0) {
              iVar48 = 0;
            }
            else {
              iVar48 = pvVar3->dangle5[uVar21][lVar53];
            }
            if (2 < uVar21) {
              iVar48 = iVar48 + pvVar3->TerminalAU;
            }
            piVar32[1] = iVar48 + piVar14[(long)iVar19 + 2];
            if (puVar16 != (undefined1 *)0x0) {
              iVar19 = (*(code *)puVar16)(psVar46,2,(ulong)psVar46 & 0xffffffff,&sc_wrapper);
              piVar32[1] = piVar32[1] + iVar19;
            }
          }
        }
        iVar37 = decompose_f5_ext_stem(fc,iVar36,piVar32);
        iVar19 = piVar32[1];
        free(piVar32);
        piVar32 = (int *)vrna_alloc(uVar51);
        puVar17 = sc_wrapper.decomp_stem1;
        puVar16 = sc_wrapper.red_stem;
        pvVar3 = fc->params;
        piVar31 = fc->jindx;
        piVar14 = (fc->matrices->field_2).field_0.c;
        uVar21 = (pvVar3->model_details).min_loop_size;
        uVar35 = iVar36 - 1;
        iVar48 = piVar31[(long)((long)&psVar46[-1].user_data_comparative + 7)];
        uVar45 = (ulong)(~uVar21 + iVar36);
        if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
          uVar24 = fc->length;
          uVar25 = (fc->field_23).field_1.n_seq;
          uVar43 = (ulong)uVar25;
          pcVar10 = (fc->field_23).field_0.ptype_pf_compat;
          ppsVar11 = (fc->field_23).field_1.S3;
          ppuVar12 = (fc->field_23).field_1.a2s;
          uVar25 = uVar25 * 2;
          pvVar29 = vrna_alloc(uVar25);
          pvVar30 = vrna_alloc(uVar25);
          for (uVar33 = 0; uVar43 != uVar33; uVar33 = uVar33 + 1) {
            puVar13 = ppuVar12[uVar33];
            sVar34 = -1;
            if (puVar13[(long)((long)&psVar46[-1].user_data_comparative + 7)] < puVar13[uVar24]) {
              sVar34 = ppsVar11[uVar33][(long)((long)&psVar46[-1].user_data_comparative + 7)];
            }
            *(short *)((long)pvVar29 + uVar33 * 2) = sVar34;
            *(undefined2 *)((long)pvVar30 + uVar33 * 2) =
                 *(undefined2 *)(*(long *)(pcVar10 + uVar33 * 8) + -2 + (long)psVar46 * 2);
          }
          lVar53 = (long)(int)(~uVar21 + iVar36 + iVar48);
          for (uVar33 = uVar45; iVar48 = (int)uVar33, 1 < iVar48; uVar33 = uVar33 - 1) {
            piVar32[uVar33] = 10000000;
            if ((piVar14[lVar53] != 10000000) &&
               (uVar18 = (*evaluate)(1,iVar36,iVar48 + -1,iVar48,'\x13',&hc_dat_local),
               uVar18 != '\0')) {
              piVar32[uVar33] = piVar14[lVar53];
              for (uVar47 = 0; uVar43 != uVar47; uVar47 = uVar47 + 1) {
                uVar24 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar10 + uVar47 * 8) +
                                                          uVar33 * 2),
                                           (int)*(short *)((long)pvVar30 + uVar47 * 2),
                                           &pvVar3->model_details);
                lVar42 = (long)*(short *)((long)pvVar29 + uVar47 * 2);
                if (lVar42 < 0) {
                  iVar48 = 0;
                }
                else {
                  iVar48 = pvVar3->dangle3[uVar24][lVar42];
                }
                if (2 < uVar24) {
                  iVar48 = iVar48 + pvVar3->TerminalAU;
                }
                piVar32[uVar33] = piVar32[uVar33] + iVar48;
              }
            }
            lVar53 = lVar53 + -1;
          }
          if (puVar17 != (undefined1 *)0x0) {
            iVar48 = iVar23 - uVar21;
            for (; 1 < (int)uVar45; uVar45 = uVar45 - 1) {
              if (piVar32[uVar45] != 10000000) {
                iVar52 = (*(code *)puVar17)(psVar46,iVar48,uVar45,&sc_wrapper);
                piVar32[uVar45] = piVar32[uVar45] + iVar52;
              }
              iVar48 = iVar48 + -1;
            }
          }
          piVar32[1] = 10000000;
          iVar48 = piVar31[(long)((long)&psVar46[-1].user_data_comparative + 7)];
          if ((piVar14[(long)iVar48 + 1] != 10000000) &&
             (uVar18 = (*evaluate)(1,iVar36,1,uVar35,'\x0e',&hc_dat_local), uVar18 != '\0')) {
            piVar32[1] = piVar14[(long)iVar48 + 1];
            for (uVar45 = 0; uVar43 != uVar45; uVar45 = uVar45 + 1) {
              uVar21 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar10 + uVar45 * 8) + 2),
                                         (int)*(short *)((long)pvVar30 + uVar45 * 2),
                                         &pvVar3->model_details);
              lVar53 = (long)*(short *)((long)pvVar29 + uVar45 * 2);
              if (lVar53 < 0) {
                iVar48 = 0;
              }
              else {
                iVar48 = pvVar3->dangle3[uVar21][lVar53];
              }
              if (2 < uVar21) {
                iVar48 = iVar48 + pvVar3->TerminalAU;
              }
              piVar32[1] = piVar32[1] + iVar48;
            }
            if (puVar16 != (undefined1 *)0x0) {
              iVar48 = (*(code *)puVar16)(psVar46,1,uVar35,&sc_wrapper);
              piVar32[1] = piVar32[1] + iVar48;
            }
          }
          free(pvVar29);
          free(pvVar30);
        }
        else if (fc->type == VRNA_FC_TYPE_SINGLE) {
          pcVar10 = (fc->field_23).field_0.ptype;
          uVar1 = (fc->field_23).field_0.sequence_encoding[(long)psVar46];
          iVar52 = iVar23 - uVar21;
          iVar48 = (iVar48 + local_148) - uVar21;
          for (lVar53 = 0; iVar39 = (int)lVar53, iVar38 = iVar52 + iVar39 + 1, 1 < iVar38;
              lVar53 = lVar53 + -1) {
            piVar32[(ulong)(local_148 - uVar21) + lVar53] = 10000000;
            if (piVar14[iVar48 + lVar53] != 10000000) {
              uVar18 = (*evaluate)(1,iVar36,iVar52 + iVar39,iVar38,'\x13',&hc_dat_local);
              if (uVar18 != '\0') {
                uVar24 = vrna_get_ptype(iVar39 + iVar48,pcVar10);
                if ((short)uVar1 < 0) {
                  iVar39 = 0;
                }
                else {
                  iVar39 = pvVar3->dangle3[uVar24][uVar1];
                }
                if (2 < uVar24) {
                  iVar39 = iVar39 + pvVar3->TerminalAU;
                }
                piVar32[(ulong)(local_148 - uVar21) + lVar53] = iVar39 + piVar14[iVar48 + lVar53];
              }
            }
          }
          if (puVar17 != (undefined1 *)0x0) {
            for (; 1 < (int)uVar45; uVar45 = uVar45 - 1) {
              if (piVar32[uVar45] != 10000000) {
                iVar48 = (*(code *)puVar17)((ulong)psVar46 & 0xffffffff,iVar52,uVar45,&sc_wrapper);
                piVar32[uVar45] = piVar32[uVar45] + iVar48;
              }
              iVar52 = iVar52 + -1;
            }
          }
          piVar32[1] = 10000000;
          iVar48 = piVar31[(long)((long)&psVar46[-1].user_data_comparative + 7)];
          if ((piVar14[(long)iVar48 + 1] != 10000000) &&
             (uVar18 = (*evaluate)(1,iVar36,1,uVar35,'\x0e',&hc_dat_local), uVar18 != '\0')) {
            uVar21 = vrna_get_ptype(iVar48 + 1,pcVar10);
            if ((short)uVar1 < 0) {
              iVar52 = 0;
            }
            else {
              iVar52 = pvVar3->dangle3[uVar21][uVar1];
            }
            if (2 < uVar21) {
              iVar52 = iVar52 + pvVar3->TerminalAU;
            }
            piVar32[1] = iVar52 + piVar14[(long)iVar48 + 1];
            if (puVar16 != (undefined1 *)0x0) {
              iVar48 = (*(code *)puVar16)(psVar46,1,uVar35,&sc_wrapper);
              piVar32[1] = piVar32[1] + iVar48;
            }
          }
        }
        iVar52 = decompose_f5_ext_stem(fc,iVar36,piVar32);
        iVar48 = piVar32[1];
        free(piVar32);
        stems_00 = (default_data *)vrna_alloc(uVar51);
        puVar17 = sc_wrapper.decomp_stem1;
        puVar16 = sc_wrapper.red_stem;
        pvVar3 = fc->params;
        piVar31 = fc->jindx;
        pdVar41 = (default_data *)(fc->matrices->field_2).field_0.c;
        uVar21 = (pvVar3->model_details).min_loop_size;
        uVar51 = piVar31[(long)((long)&psVar46[-1].user_data_comparative + 7)];
        psVar49 = (sc_wrapper_f5 *)(ulong)uVar51;
        if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
          uVar24 = fc->length;
          uVar25 = (fc->field_23).field_1.n_seq;
          uVar33 = (ulong)uVar25;
          pcVar10 = (fc->field_23).field_0.ptype_pf_compat;
          pvVar6 = (fc->field_23).field_0.sc;
          ppsVar11 = (fc->field_23).field_1.S3;
          ppuVar12 = (fc->field_23).field_1.a2s;
          uVar25 = uVar25 * 2;
          pvVar29 = vrna_alloc(uVar25);
          pvVar30 = vrna_alloc(uVar25);
          for (uVar45 = 0; uVar33 != uVar45; uVar45 = uVar45 + 1) {
            sVar34 = -1;
            if (ppuVar12[uVar45][(long)((long)&psVar46[-1].user_data_comparative + 7)] <
                ppuVar12[uVar45][uVar24]) {
              sVar34 = ppsVar11[uVar45][(long)((long)&psVar46[-1].user_data_comparative + 7)];
            }
            *(short *)((long)pvVar29 + uVar45 * 2) = sVar34;
            *(undefined2 *)((long)pvVar30 + uVar45 * 2) =
                 *(undefined2 *)(*(long *)(pcVar10 + uVar45 * 8) + -2 + (long)psVar46 * 2);
          }
          local_190 = (long)(int)((iVar36 - uVar21) + uVar51);
          uVar43 = (ulong)(~uVar21 + iVar36);
          for (uVar45 = uVar43; iVar39 = (int)uVar45, 1 < iVar39; uVar45 = uVar45 - 1) {
            (&stems_00->n)[uVar45] = 10000000;
            if ((&pdVar41->n)[local_190] != 10000000) {
              psVar49 = (sc_wrapper_f5 *)0x13;
              uVar18 = (*evaluate)(1,iVar36,iVar39 + -1,iVar39 + 1,'\x13',&hc_dat_local);
              if (uVar18 != '\0') {
                (&stems_00->n)[uVar45] = (&pdVar41->n)[local_190];
                for (uVar47 = 0; uVar33 != uVar47; uVar47 = uVar47 + 1) {
                  uVar51 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar10 + uVar47 * 8) + 2 +
                                                            uVar45 * 2),
                                             (int)*(short *)((long)pvVar30 + uVar47 * 2),
                                             &pvVar3->model_details);
                  iVar39 = -1;
                  if (1 < ppuVar12[uVar47][uVar45 + 1]) {
                    iVar39 = (int)*(short *)(*(long *)(&pvVar6->type + uVar47 * 2) + 2 + uVar45 * 2)
                    ;
                  }
                  iVar39 = vrna_E_ext_stem(uVar51,iVar39,(int)*(short *)((long)pvVar29 + uVar47 * 2)
                                           ,pvVar3);
                  (&stems_00->n)[uVar45] = (&stems_00->n)[uVar45] + iVar39;
                }
              }
            }
            local_190 = local_190 + -1;
          }
          if (puVar17 != (undefined1 *)0x0) {
            iVar39 = iVar36 - uVar21;
            iVar38 = iVar23 - uVar21;
            for (; 1 < (int)uVar43; uVar43 = uVar43 - 1) {
              if ((&stems_00->n)[uVar43] != 10000000) {
                iVar26 = (*(code *)puVar17)(psVar46,iVar38,iVar39,&sc_wrapper);
                (&stems_00->n)[uVar43] = (&stems_00->n)[uVar43] + iVar26;
              }
              iVar39 = iVar39 + -1;
              iVar38 = iVar38 + -1;
            }
          }
          *(undefined4 *)&stems_00->field_0x4 = 10000000;
          iVar39 = piVar31[(long)((long)&psVar46[-1].user_data_comparative + 7)];
          hc_dat_local_01 = pdVar41;
          if (*(int *)((long)&pdVar41->mx + (long)iVar39 * 4) != 10000000) {
            hc_dat_local_01 = (default_data *)(ulong)uVar35;
            psVar49 = (sc_wrapper_f5 *)0xe;
            uVar18 = (*evaluate)(1,iVar36,2,uVar35,'\x0e',&hc_dat_local);
            if (uVar18 != '\0') {
              *(undefined4 *)&stems_00->field_0x4 =
                   *(undefined4 *)((long)&pdVar41->mx + (long)iVar39 * 4);
              for (uVar45 = 0; uVar33 != uVar45; uVar45 = uVar45 + 1) {
                uVar21 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar10 + uVar45 * 8) + 4),
                                           (int)*(short *)((long)pvVar30 + uVar45 * 2),
                                           &pvVar3->model_details);
                iVar39 = -1;
                if (1 < ppuVar12[uVar45][2]) {
                  iVar39 = (int)*(short *)(*(long *)(&pvVar6->type + uVar45 * 2) + 4);
                }
                iVar39 = vrna_E_ext_stem(uVar21,iVar39,(int)*(short *)((long)pvVar29 + uVar45 * 2),
                                         pvVar3);
                *(int *)&stems_00->field_0x4 = *(int *)&stems_00->field_0x4 + iVar39;
              }
              hc_dat_local_01 = stems_00;
              if (puVar16 != (undefined1 *)0x0) {
                iVar39 = (*(code *)puVar16)(psVar46,2,uVar35,&sc_wrapper);
                *(int *)&stems_00->field_0x4 = *(int *)&stems_00->field_0x4 + iVar39;
              }
            }
          }
          free(pvVar29);
          free(pvVar30);
        }
        else {
          hc_dat_local_01 = (default_data *)sc_wrapper.red_stem;
          if (fc->type == VRNA_FC_TYPE_SINGLE) {
            psVar9 = (fc->field_23).field_0.sequence_encoding;
            pcVar10 = (fc->field_23).field_0.ptype;
            sVar34 = psVar9[(long)psVar46];
            uVar45 = (ulong)(~uVar21 + iVar36);
            iVar39 = iVar23 - uVar21;
            uVar51 = (uVar51 + iVar36) - uVar21;
            psVar49 = (sc_wrapper_f5 *)(ulong)uVar51;
            for (lVar53 = 0; iVar38 = (int)lVar53, 1 < iVar38 + iVar39 + 1; lVar53 = lVar53 + -1) {
              (&stems_00->n)[(ulong)(local_148 - uVar21) + lVar53] = 10000000;
              if ((&pdVar41->n)[(int)uVar51 + lVar53] != 10000000) {
                psVar49 = (sc_wrapper_f5 *)0x13;
                uVar18 = (*evaluate)(1,iVar36,iVar38 + iVar39,iVar38 + iVar39 + 2,'\x13',
                                     &hc_dat_local);
                if (uVar18 != '\0') {
                  uVar25 = vrna_get_ptype(uVar51 + iVar38,pcVar10);
                  uVar24 = (&pdVar41->n)[(int)uVar51 + lVar53];
                  iVar38 = vrna_E_ext_stem(uVar25,(int)*(short *)((long)psVar9 +
                                                                 lVar53 * 2 +
                                                                 local_70 + (long)(int)uVar21 * -2),
                                           (int)sVar34,pvVar3);
                  (&stems_00->n)[(ulong)(local_148 - uVar21) + lVar53] = iVar38 + uVar24;
                }
              }
            }
            if (puVar17 != (undefined1 *)0x0) {
              iVar38 = iVar36 - uVar21;
              iVar39 = iVar23 - uVar21;
              for (; 1 < (int)uVar45; uVar45 = uVar45 - 1) {
                if ((&stems_00->n)[uVar45] != 10000000) {
                  iVar26 = (*(code *)puVar17)((ulong)psVar46 & 0xffffffff,iVar39,iVar38,&sc_wrapper)
                  ;
                  (&stems_00->n)[uVar45] = (&stems_00->n)[uVar45] + iVar26;
                }
                iVar38 = iVar38 + -1;
                iVar39 = iVar39 + -1;
              }
            }
            *(undefined4 *)&stems_00->field_0x4 = 10000000;
            iVar39 = piVar31[(long)((long)&psVar46[-1].user_data_comparative + 7)];
            hc_dat_local_01 = pdVar41;
            if (*(int *)((long)&pdVar41->mx + (long)iVar39 * 4) != 10000000) {
              hc_dat_local_01 = (default_data *)(ulong)uVar35;
              psVar49 = (sc_wrapper_f5 *)0xe;
              uVar18 = (*evaluate)(1,iVar36,2,uVar35,'\x0e',&hc_dat_local);
              if (uVar18 != '\0') {
                uVar21 = vrna_get_ptype(iVar39 + 2,pcVar10);
                iVar39 = *(int *)((long)&pdVar41->mx + (long)iVar39 * 4);
                iVar38 = vrna_E_ext_stem(uVar21,(int)psVar9[1],(int)sVar34,pvVar3);
                *(int *)&stems_00->field_0x4 = iVar38 + iVar39;
                hc_dat_local_01 = stems_00;
                if (puVar16 != (undefined1 *)0x0) {
                  iVar39 = (*(code *)puVar16)(psVar46,2,uVar35,&sc_wrapper);
                  *(int *)&stems_00->field_0x4 = *(int *)&stems_00->field_0x4 + iVar39;
                }
              }
            }
          }
        }
        if (iVar52 < iVar48) {
          iVar48 = iVar52;
        }
        if (iVar37 < iVar19) {
          iVar19 = iVar37;
        }
        if (iVar22 < iVar20) {
          iVar20 = iVar22;
        }
        iVar37 = decompose_f5_ext_stem(fc,iVar36,(int *)stems_00);
        iVar22 = *(int *)&stems_00->field_0x4;
        if (iVar37 < *(int *)&stems_00->field_0x4) {
          iVar22 = iVar37;
        }
        if (iVar19 <= iVar20) {
          iVar20 = iVar19;
        }
        if (iVar48 <= iVar20) {
          iVar20 = iVar48;
        }
        free(stems_00);
        if (iVar22 <= iVar20) {
          iVar20 = iVar22;
        }
        if (piVar4[(long)psVar46] <= iVar20) {
          iVar20 = piVar4[(long)psVar46];
        }
        if (9999999 < iVar20) {
          iVar20 = 10000000;
        }
        piVar4[(long)psVar46] = iVar20;
        if (iVar2 != 0) {
          iVar19 = add_f5_gquad(fc,iVar36,evaluate_02,hc_dat_local_01,psVar49);
          if (iVar20 < iVar19) {
            iVar19 = iVar20;
          }
          piVar4[(long)psVar46] = iVar19;
        }
        if ((pvVar5 != (vrna_gr_aux_t *)0x0) && (pvVar5->cb_aux_f != (vrna_callback_gr_rule *)0x0))
        {
          iVar20 = (*pvVar5->cb_aux_f)(fc,1,iVar36,pvVar5->data);
          if (piVar4[(long)psVar46] < iVar20) {
            iVar20 = piVar4[(long)psVar46];
          }
          piVar4[(long)psVar46] = iVar20;
        }
        iVar23 = iVar23 + 1;
        local_70 = local_70 + 2;
      }
    }
    free(sc_wrapper.up_comparative);
    free(sc_wrapper.user_cb_comparative);
    free(sc_wrapper.user_data_comparative);
    return piVar4[lVar27];
  }
  return 10000000;
}

Assistant:

PUBLIC int
vrna_E_ext_loop_5(vrna_fold_compound_t *fc)
{
  if (fc) {
    int                       en, j, length, *f5, dangle_model, with_gquad, turn;
    vrna_param_t              *P;
    vrna_callback_hc_evaluate *evaluate;
    struct default_data       hc_dat_local;
    struct sc_wrapper_f5      sc_wrapper;
    vrna_gr_aux_t             *grammar;

    length        = (int)fc->length;
    f5            = fc->matrices->f5;
    P             = fc->params;
    dangle_model  = P->model_details.dangles;
    with_gquad    = P->model_details.gquad;
    turn          = P->model_details.min_loop_size;
    grammar       = fc->aux_grammar;
    evaluate      = prepare_hc_default(fc, &hc_dat_local);

    init_sc_wrapper(fc, &sc_wrapper);

    f5[0] = 0;
    for (j = 1; j <= turn + 1; j++)
      f5[j] = reduce_f5_up(fc, j, evaluate, &hc_dat_local, &sc_wrapper);

    if ((grammar) && (grammar->cb_aux_f)) {
      for (j = 1; j <= turn + 1; j++) {
        en    = grammar->cb_aux_f(fc, 1, j, grammar->data);
        f5[j] = MIN2(f5[j], en);
      }
    }

    /*
     *  duplicated code may be faster than conditions inside loop or even
     *  using a function pointer ;)
     */
    switch (dangle_model) {
      case 2:
        for (j = turn + 2; j <= length; j++) {
          /* extend previous solution(s) by adding an unpaired region */
          f5[j] = reduce_f5_up(fc, j, evaluate, &hc_dat_local, &sc_wrapper);

          /* decompose into exterior loop part followed by a stem */
          en    = decompose_f5_ext_stem_d2(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
          f5[j] = MIN2(f5[j], en);

          if (with_gquad) {
            en    = add_f5_gquad(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
            f5[j] = MIN2(f5[j], en);
          }

          if ((grammar) && (grammar->cb_aux_f)) {
            en    = grammar->cb_aux_f(fc, 1, j, grammar->data);
            f5[j] = MIN2(f5[j], en);
          }
        }
        break;

      case 0:
        for (j = turn + 2; j <= length; j++) {
          /* extend previous solution(s) by adding an unpaired region */
          f5[j] = reduce_f5_up(fc, j, evaluate, &hc_dat_local, &sc_wrapper);

          /* decompose into exterior loop part followed by a stem */
          en    = decompose_f5_ext_stem_d0(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
          f5[j] = MIN2(f5[j], en);

          if (with_gquad) {
            en    = add_f5_gquad(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
            f5[j] = MIN2(f5[j], en);
          }

          if ((grammar) && (grammar->cb_aux_f)) {
            en    = grammar->cb_aux_f(fc, 1, j, grammar->data);
            f5[j] = MIN2(f5[j], en);
          }
        }
        break;

      default:
        for (j = turn + 2; j <= length; j++) {
          /* extend previous solution(s) by adding an unpaired region */
          f5[j] = reduce_f5_up(fc, j, evaluate, &hc_dat_local, &sc_wrapper);

          en    = decompose_f5_ext_stem_d1(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
          f5[j] = MIN2(f5[j], en);

          if (with_gquad) {
            en    = add_f5_gquad(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
            f5[j] = MIN2(f5[j], en);
          }

          if ((grammar) && (grammar->cb_aux_f)) {
            en    = grammar->cb_aux_f(fc, 1, j, grammar->data);
            f5[j] = MIN2(f5[j], en);
          }
        }
        break;
    }

    free_sc_wrapper(&sc_wrapper);

    return f5[length];
  }

  return INF;
}